

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O2

Type miniscript::internal::SanitizeType(Type e)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *__assertion;
  long in_FS_OFFSET;
  
  uVar1 = e.m_flags & 2;
  iVar2 = (e.m_flags & 1) + (uVar1 >> 1) + (e.m_flags >> 2 & 1) + (uint)((e.m_flags >> 3 & 1) != 0);
  if (iVar2 != 0) {
    if (iVar2 != 1) {
      __assertion = "num_types == 1";
      uVar1 = 0x13;
      goto LAB_001811be;
    }
    uVar3 = ~e.m_flags;
    if ((e.m_flags & 0x10) == 0) {
      if ((uVar3 & 0x48) == 0) {
        __assertion = "!(e << \"n\"_mst) || !(e << \"W\"_mst)";
        uVar1 = 0x16;
        goto LAB_001811be;
      }
    }
    else {
      if ((e.m_flags & 0x20) != 0) {
        __assertion = "!(e << \"z\"_mst) || !(e << \"o\"_mst)";
        uVar1 = 0x14;
        goto LAB_001811be;
      }
      if ((e.m_flags & 0x40) != 0) {
        __assertion = "!(e << \"n\"_mst) || !(e << \"z\"_mst)";
        uVar1 = 0x15;
        goto LAB_001811be;
      }
    }
    if ((uVar3 & 0x82) == 0) {
      __assertion = "!(e << \"V\"_mst) || !(e << \"d\"_mst)";
      uVar1 = 0x17;
    }
    else if ((e.m_flags & 0x104) == 4) {
      __assertion = "!(e << \"K\"_mst) || (e << \"u\"_mst)";
      uVar1 = 0x18;
    }
    else if ((uVar1 == 0) || ((e.m_flags >> 8 & 1) == 0)) {
      if ((e.m_flags >> 9 & 1) != 0) {
        if ((e.m_flags >> 10 & 1) != 0) {
          __assertion = "!(e << \"e\"_mst) || !(e << \"f\"_mst)";
          uVar1 = 0x1a;
          goto LAB_001811be;
        }
        if (-1 < (char)e.m_flags) {
          __assertion = "!(e << \"e\"_mst) || (e << \"d\"_mst)";
          uVar1 = 0x1b;
          goto LAB_001811be;
        }
        if (uVar1 != 0) {
          __assertion = "!(e << \"V\"_mst) || !(e << \"e\"_mst)";
          uVar1 = 0x1c;
          goto LAB_001811be;
        }
      }
      if ((uVar3 & 0x480) == 0) {
        __assertion = "!(e << \"d\"_mst) || !(e << \"f\"_mst)";
        uVar1 = 0x1d;
      }
      else if ((e.m_flags & 0x402) == 2) {
        __assertion = "!(e << \"V\"_mst) || (e << \"f\"_mst)";
        uVar1 = 0x1e;
      }
      else if ((e.m_flags & 0x804) == 4) {
        __assertion = "!(e << \"K\"_mst) || (e << \"s\"_mst)";
        uVar1 = 0x1f;
      }
      else {
        if ((e.m_flags & 0x1010) != 0x10) goto LAB_0018104e;
        __assertion = "!(e << \"z\"_mst) || (e << \"m\"_mst)";
        uVar1 = 0x20;
      }
    }
    else {
      __assertion = "!(e << \"V\"_mst) || !(e << \"u\"_mst)";
      uVar1 = 0x19;
    }
LAB_001811be:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                  ,uVar1,"Type miniscript::internal::SanitizeType(Type)");
  }
  e.m_flags = 0;
LAB_0018104e:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Type)e.m_flags;
  }
  __stack_chk_fail();
}

Assistant:

Type SanitizeType(Type e) {
    int num_types = (e << "K"_mst) + (e << "V"_mst) + (e << "B"_mst) + (e << "W"_mst);
    if (num_types == 0) return ""_mst; // No valid type, don't care about the rest
    assert(num_types == 1); // K, V, B, W all conflict with each other
    assert(!(e << "z"_mst) || !(e << "o"_mst)); // z conflicts with o
    assert(!(e << "n"_mst) || !(e << "z"_mst)); // n conflicts with z
    assert(!(e << "n"_mst) || !(e << "W"_mst)); // n conflicts with W
    assert(!(e << "V"_mst) || !(e << "d"_mst)); // V conflicts with d
    assert(!(e << "K"_mst) ||  (e << "u"_mst)); // K implies u
    assert(!(e << "V"_mst) || !(e << "u"_mst)); // V conflicts with u
    assert(!(e << "e"_mst) || !(e << "f"_mst)); // e conflicts with f
    assert(!(e << "e"_mst) ||  (e << "d"_mst)); // e implies d
    assert(!(e << "V"_mst) || !(e << "e"_mst)); // V conflicts with e
    assert(!(e << "d"_mst) || !(e << "f"_mst)); // d conflicts with f
    assert(!(e << "V"_mst) ||  (e << "f"_mst)); // V implies f
    assert(!(e << "K"_mst) ||  (e << "s"_mst)); // K implies s
    assert(!(e << "z"_mst) ||  (e << "m"_mst)); // z implies m
    return e;
}